

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLcode Curl_alpn_set_negotiated(Curl_cfilter *cf,Curl_easy *data,uchar *proto,size_t proto_len)

{
  connectdata *pcVar1;
  bool bVar2;
  long lVar3;
  undefined1 uVar4;
  
  pcVar1 = cf->conn;
  if ((((uint)pcVar1->bits & 8) == 0) || (cf->cft != &Curl_cft_ssl_proxy)) {
    lVar3 = 0x47c;
  }
  else {
    lVar3 = 0x47d;
  }
  if (proto_len == 0 || proto == (uchar *)0x0) {
    *(undefined1 *)((long)&(pcVar1->bundle_node).ptr + lVar3) = 0;
    bVar2 = false;
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      bVar2 = false;
      Curl_infof(data,"ALPN: server did not agree on a protocol. Uses default.");
    }
    goto LAB_005d0e78;
  }
  if (proto_len == 2) {
    if (*(short *)proto == 0x3268) {
      bVar2 = true;
      uVar4 = 3;
      goto LAB_005d0e50;
    }
  }
  else if ((proto_len == 8) && (*(long *)proto == 0x312e312f70747468)) {
    bVar2 = false;
    uVar4 = 2;
LAB_005d0e50:
    *(undefined1 *)((long)&(pcVar1->bundle_node).ptr + lVar3) = uVar4;
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"ALPN: server accepted %.*s",proto_len & 0xffffffff,proto);
    }
    goto LAB_005d0e78;
  }
  *(undefined1 *)((long)&(pcVar1->bundle_node).ptr + lVar3) = 0;
  bVar2 = false;
  Curl_failf(data,"unsupported ALPN protocol: \'%.*s\'",proto_len & 0xffffffff,proto);
LAB_005d0e78:
  if (cf->cft != &Curl_cft_ssl_proxy) {
    Curl_multiuse_state(data,-(uint)!bVar2 | 2);
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_alpn_set_negotiated(struct Curl_cfilter *cf,
                                  struct Curl_easy *data,
                                  const unsigned char *proto,
                                  size_t proto_len)
{
  int can_multi = 0;
  unsigned char *palpn =
#ifndef CURL_DISABLE_PROXY
    (cf->conn->bits.tunnel_proxy && Curl_ssl_cf_is_proxy(cf))?
    &cf->conn->proxy_alpn : &cf->conn->alpn
#else
    &cf->conn->alpn
#endif
    ;

  if(proto && proto_len) {
    if(proto_len == ALPN_HTTP_1_1_LENGTH &&
       !memcmp(ALPN_HTTP_1_1, proto, ALPN_HTTP_1_1_LENGTH)) {
      *palpn = CURL_HTTP_VERSION_1_1;
    }
#ifdef USE_HTTP2
    else if(proto_len == ALPN_H2_LENGTH &&
            !memcmp(ALPN_H2, proto, ALPN_H2_LENGTH)) {
      *palpn = CURL_HTTP_VERSION_2;
      can_multi = 1;
    }
#endif
#ifdef USE_HTTP3
    else if(proto_len == ALPN_H3_LENGTH &&
            !memcmp(ALPN_H3, proto, ALPN_H3_LENGTH)) {
      *palpn = CURL_HTTP_VERSION_3;
      can_multi = 1;
    }
#endif
    else {
      *palpn = CURL_HTTP_VERSION_NONE;
      failf(data, "unsupported ALPN protocol: '%.*s'", (int)proto_len, proto);
      /* TODO: do we want to fail this? Previous code just ignored it and
       * some vtls backends even ignore the return code of this function. */
      /* return CURLE_NOT_BUILT_IN; */
      goto out;
    }
    infof(data, VTLS_INFOF_ALPN_ACCEPTED_LEN_1STR, (int)proto_len, proto);
  }
  else {
    *palpn = CURL_HTTP_VERSION_NONE;
    infof(data, VTLS_INFOF_NO_ALPN);
  }

out:
  if(!Curl_ssl_cf_is_proxy(cf))
    Curl_multiuse_state(data, can_multi?
                        BUNDLE_MULTIPLEX : BUNDLE_NO_MULTIUSE);
  return CURLE_OK;
}